

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageBase.cpp
# Opt level: O2

void processLevel(string *s)

{
  pointer pcVar1;
  size_type sVar2;
  __type_conflict2 _Var3;
  int iVar4;
  level_enum lVar5;
  long lVar6;
  mapped_type *pmVar7;
  string *__range1;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type sVar8;
  string monitor_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  monitors;
  string level_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  for (sVar8 = 0; sVar2 != sVar8; sVar8 = sVar8 + 1) {
    iVar4 = tolower((int)pcVar1[sVar8]);
    pcVar1[sVar8] = (char)iVar4;
  }
  lVar6 = std::__cxx11::string::find((char)s,0x3a);
  if (lVar6 == -1) {
    lVar5 = spdlog::level::from_str(s);
    if (lVar5 == off) {
      std::operator+(&monitor_name,"Invalid level name ",s);
      spdlog::error<std::__cxx11::string>(&monitor_name);
      std::__cxx11::string::~string((string *)&monitor_name);
      invalid_level_option = true;
      lVar5 = global_logging_level;
    }
  }
  else {
    std::__cxx11::string::find((char)s,0x3a);
    std::__cxx11::string::substr((ulong)&monitor_name,(ulong)s);
    std::__cxx11::string::substr((ulong)&level_name,(ulong)s);
    prmon::get_all_registered_abi_cxx11_();
    __lhs = monitors.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (__lhs == monitors.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_40,"Invalid monitor name ",&monitor_name);
        std::operator+(&local_98,&local_40," for logging level");
        spdlog::error<std::__cxx11::string>(&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        this = &local_40;
        goto LAB_00199a81;
      }
      _Var3 = std::operator==(__lhs,&monitor_name);
      __lhs = __lhs + 1;
    } while (!_Var3);
    lVar5 = spdlog::level::from_str(&level_name);
    if (lVar5 == off) {
      std::operator+(&local_98,"Invalid level name ",&level_name);
      spdlog::error<std::__cxx11::string>(&local_98);
      this = &local_98;
LAB_00199a81:
      std::__cxx11::string::~string((string *)this);
      invalid_level_option = true;
    }
    else {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>_>
               ::operator[](&monitor_level_abi_cxx11_,&monitor_name);
      *pmVar7 = lVar5;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&monitors);
    std::__cxx11::string::~string((string *)&level_name);
    std::__cxx11::string::~string((string *)&monitor_name);
    lVar5 = global_logging_level;
  }
  global_logging_level = lVar5;
  return;
}

Assistant:

void processLevel(std::string s) {
  for (auto& ch : s) {
    ch = std::tolower(ch);
  }
  if (s.find(':') == std::string::npos) {
    // No ':' in option -> set global level
    spdlog::level::level_enum get_level_enum = spdlog::level::from_str(s);
    if (get_level_enum == 6) {
      // Invalid name
      spdlog::error("Invalid level name " + s);
      invalid_level_option = true;
    } else
      global_logging_level = get_level_enum;
  } else {
    size_t split_index = s.find(':');
    std::string monitor_name = s.substr(0, split_index);
    std::string level_name =
        s.substr(split_index + 1, s.size() - (split_index + 1));

    // Check validity of monitor name
    bool valid_monitor = false;
    auto monitors = prmon::get_all_registered();
    for (const auto& monitor : monitors) {
      if (monitor == monitor_name) {
        valid_monitor = true;
        break;
      }
    }
    if (!valid_monitor) {
      spdlog::error("Invalid monitor name " + monitor_name +
                    " for logging level");
      invalid_level_option = true;
      return;
    }
    // Check validity of level name
    spdlog::level::level_enum get_level_enum =
        spdlog::level::from_str(level_name);
    if (get_level_enum == 6) {
      // Invalid name
      spdlog::error("Invalid level name " + level_name);
      invalid_level_option = true;
      return;
    }

    monitor_level[monitor_name] = get_level_enum;
  }
}